

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O0

Hop_Obj_t * Hop_Transfer(Hop_Man_t *pSour,Hop_Man_t *pDest,Hop_Obj_t *pRoot,int nVars)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  undefined8 *puVar3;
  int local_3c;
  int i;
  Hop_Obj_t *pObj;
  int nVars_local;
  Hop_Obj_t *pRoot_local;
  Hop_Man_t *pDest_local;
  Hop_Man_t *pSour_local;
  
  pSour_local = (Hop_Man_t *)pRoot;
  if (pSour != pDest) {
    pHVar2 = Hop_Regular(pRoot);
    iVar1 = Hop_ObjIsConst1(pHVar2);
    if (iVar1 == 0) {
      for (local_3c = 0;
          (iVar1 = Vec_PtrSize(pSour->vPis), local_3c < iVar1 &&
          (puVar3 = (undefined8 *)Vec_PtrEntry(pSour->vPis,local_3c), local_3c != nVars));
          local_3c = local_3c + 1) {
        pHVar2 = Hop_IthVar(pDest,local_3c);
        *puVar3 = pHVar2;
      }
      pHVar2 = Hop_Regular(pRoot);
      Hop_Transfer_rec(pDest,pHVar2);
      pHVar2 = Hop_Regular(pRoot);
      Hop_ConeUnmark_rec(pHVar2);
      pHVar2 = Hop_Regular(pRoot);
      pHVar2 = (Hop_Obj_t *)(pHVar2->field_0).pData;
      iVar1 = Hop_IsComplement(pRoot);
      pSour_local = (Hop_Man_t *)Hop_NotCond(pHVar2,iVar1);
    }
    else {
      pHVar2 = Hop_ManConst1(pDest);
      iVar1 = Hop_IsComplement(pRoot);
      pSour_local = (Hop_Man_t *)Hop_NotCond(pHVar2,iVar1);
    }
  }
  return (Hop_Obj_t *)pSour_local;
}

Assistant:

Hop_Obj_t * Hop_Transfer( Hop_Man_t * pSour, Hop_Man_t * pDest, Hop_Obj_t * pRoot, int nVars )
{
    Hop_Obj_t * pObj;
    int i;
    // solve simple cases
    if ( pSour == pDest )
        return pRoot;
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
        return Hop_NotCond( Hop_ManConst1(pDest), Hop_IsComplement(pRoot) );
    // set the PI mapping
    Hop_ManForEachPi( pSour, pObj, i )
    {
        if ( i == nVars )
           break;
        pObj->pData = Hop_IthVar(pDest, i);
    }
    // transfer and set markings
    Hop_Transfer_rec( pDest, Hop_Regular(pRoot) );
    // clear the markings
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Hop_NotCond( (Hop_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}